

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_initRemainingDStream
                 (BIT_DStream_t *bit,HUF_DecompressFastArgs *args,int stream,BYTE *segmentEnd)

{
  uint uVar1;
  size_t sVar2;
  BYTE *segmentEnd_local;
  int stream_local;
  HUF_DecompressFastArgs *args_local;
  BIT_DStream_t *bit_local;
  
  if (segmentEnd < args->op[stream]) {
    bit_local = (BIT_DStream_t *)0xffffffffffffffec;
  }
  else if (args->ip[stream] < args->iend[stream] + -8) {
    bit_local = (BIT_DStream_t *)0xffffffffffffffec;
  }
  else {
    sVar2 = MEM_readLEST(args->ip[stream]);
    bit->bitContainer = sVar2;
    uVar1 = ZSTD_countTrailingZeros64(args->bits[stream]);
    bit->bitsConsumed = uVar1;
    bit->start = (char *)args->iend[0];
    bit->limitPtr = bit->start + 8;
    bit->ptr = (char *)args->ip[stream];
    bit_local = (BIT_DStream_t *)0x0;
  }
  return (size_t)bit_local;
}

Assistant:

static size_t HUF_initRemainingDStream(BIT_DStream_t* bit, HUF_DecompressFastArgs const* args, int stream, BYTE* segmentEnd)
{
    /* Validate that we haven't overwritten. */
    if (args->op[stream] > segmentEnd)
        return ERROR(corruption_detected);
    /* Validate that we haven't read beyond iend[].
        * Note that ip[] may be < iend[] because the MSB is
        * the next bit to read, and we may have consumed 100%
        * of the stream, so down to iend[i] - 8 is valid.
        */
    if (args->ip[stream] < args->iend[stream] - 8)
        return ERROR(corruption_detected);

    /* Construct the BIT_DStream_t. */
    assert(sizeof(size_t) == 8);
    bit->bitContainer = MEM_readLEST(args->ip[stream]);
    bit->bitsConsumed = ZSTD_countTrailingZeros64(args->bits[stream]);
    bit->start = (const char*)args->iend[0];
    bit->limitPtr = bit->start + sizeof(size_t);
    bit->ptr = (const char*)args->ip[stream];

    return 0;
}